

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

void __thiscall QDialog::adjustPosition(QDialog *this,QWidget *w)

{
  QDialogPrivate *this_00;
  QWidget *this_01;
  QWidgetData *pQVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QScreen *pQVar7;
  QPoint QVar8;
  unsigned_long_long uVar9;
  QWindow *pQVar10;
  int i;
  undefined1 *puVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  Representation RVar16;
  int iVar17;
  long in_FS_OFFSET;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  QWidget *local_b0;
  QPoint *local_a8;
  QArrayDataPointer<QWidget_*> local_78;
  QPoint local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QWidget).field_0x8;
  if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
    (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
              (&local_58,QGuiApplicationPrivate::platform_theme,0x12);
    cVar3 = ::QVariant::toBool();
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (cVar3 != '\0') goto LAB_00493682;
  }
  local_60.xp.m_i = 0;
  local_60.yp.m_i = 0;
  if (w == (QWidget *)0x0) {
    local_a8 = (QPoint *)QDialogPrivate::transientParentWindow(this_00);
    if (local_a8 == (QPoint *)0x0) goto LAB_00493369;
    pQVar7 = (QScreen *)QWindow::screen();
    bVar2 = true;
    local_b0 = (QWidget *)0x0;
  }
  else {
    local_b0 = QWidget::window(w);
    if (local_b0 == (QWidget *)0x0) {
LAB_00493369:
      QGuiApplication::primaryScreen();
      QScreen::virtualSiblings();
      QArrayDataPointer<QScreen_*>::~QArrayDataPointer((QArrayDataPointer<QScreen_*> *)&local_58);
      if ((ulong)local_58._16_8_ < 2) {
        pQVar7 = QWidget::screen(&this->super_QWidget);
      }
      else {
        local_58.shared = (PrivateShared *)QCursor::pos();
        pQVar7 = (QScreen *)QGuiApplication::screenAt((QPoint *)&local_58.shared);
      }
      bVar2 = true;
      local_b0 = (QWidget *)0x0;
    }
    else {
      pQVar7 = QWidget::screen(local_b0);
      bVar2 = false;
    }
    local_a8 = (QPoint *)0x0;
  }
  iVar12 = 0;
  if (pQVar7 == (QScreen *)0x0) {
    auVar20 = ZEXT816(0xffffffffffffffff) << 0x40;
  }
  else {
    auVar20 = QScreen::availableGeometry();
  }
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  QApplication::topLevelWidgets();
  puVar11 = (undefined1 *)0x0;
  iVar6 = 0;
  while( true ) {
    bVar18 = iVar6 != 0;
    bVar19 = iVar12 != 0;
    if ((bVar19 && bVar18) || ((ulong)local_78.size <= puVar11)) break;
    this_01 = local_78.ptr[(long)puVar11];
    if ((this_01->data->widget_attributes & 0x8000) != 0) {
      iVar17 = (this_01->data->crect).x1.m_i;
      iVar4 = QWidget::x(this_01);
      iVar17 = iVar17 - iVar4;
      iVar4 = (this_01->data->crect).y1.m_i;
      iVar5 = QWidget::y(this_01);
      iVar4 = iVar4 - iVar5;
      if (iVar6 <= iVar17) {
        iVar6 = iVar17;
      }
      if (iVar12 <= iVar4) {
        iVar12 = iVar4;
      }
    }
    puVar11 = puVar11 + 1;
  }
  iVar17 = 0x28;
  if ((iVar12 < 0x28 && iVar6 < 10) && (bVar19 && bVar18)) {
    iVar17 = iVar12;
  }
  iVar4 = 10;
  if ((iVar12 < 0x28 && iVar6 < 10) && (bVar19 && bVar18)) {
    iVar4 = iVar6;
  }
  iVar6 = auVar20._0_4_;
  iVar12 = auVar20._4_4_;
  if (bVar2) {
    if (local_a8 != (QPoint *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      QVar8 = (QPoint)QWindow::mapToGlobal(local_a8);
      iVar5 = QWindow::width((QWindow *)local_a8);
      iVar15 = iVar5 / 2 + QVar8.xp.m_i.m_i;
      iVar5 = QWindow::height((QWindow *)local_a8);
      goto LAB_0049358c;
    }
    iVar15 = ((auVar20._8_4_ - iVar6) + 1) / 2 + iVar6;
    iVar5 = (auVar20._12_4_ - iVar12) + 1;
    RVar16.m_i = iVar12;
  }
  else {
    pQVar10 = QWidget::windowHandle(local_b0);
    if (pQVar10 == (QWindow *)0x0) {
LAB_00493553:
      local_58.shared = (PrivateShared *)0x0;
      QVar8 = QWidget::mapToGlobal(local_b0,(QPoint *)&local_58.shared);
    }
    else {
      QWidget::windowHandle(local_b0);
      QObject::property((char *)local_58.data);
      uVar9 = qvariant_cast<unsigned_long_long>((QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      if (uVar9 == 0) goto LAB_00493553;
      QVar8 = QWidget::pos(local_b0);
    }
    pQVar1 = local_b0->data;
    iVar15 = (((pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i) + 1) / 2 + QVar8.xp.m_i.m_i;
    iVar5 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
LAB_0049358c:
    RVar16.m_i = QVar8.yp.m_i.m_i;
  }
  iVar5 = iVar5 / 2 + RVar16.m_i;
  pQVar1 = (this->super_QWidget).data;
  iVar13 = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  local_60.xp.m_i = (iVar15 - iVar4) + (iVar13 + 1) / -2;
  iVar15 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
  local_60.yp.m_i = (iVar5 - iVar17) + iVar15 / -2;
  iVar13 = iVar13 + iVar4 + 1;
  iVar14 = auVar20._8_4_ + 1;
  iVar4 = iVar14 - iVar13;
  if (((iVar14 < iVar13 + local_60.xp.m_i) || (iVar4 = local_60.xp.m_i, local_60.xp.m_i < iVar6)) &&
     (local_60.xp.m_i = iVar4, iVar4 <= iVar6)) {
    local_60.xp.m_i = iVar6;
  }
  iVar4 = auVar20._12_4_ + 1;
  iVar6 = iVar4 - (iVar17 + iVar15);
  if (((iVar4 < iVar5 + iVar15 / -2 + iVar15) || (iVar6 = local_60.yp.m_i, local_60.yp.m_i < iVar12)
      ) && (local_60.yp.m_i = iVar12, iVar12 < iVar6)) {
    local_60.yp.m_i = iVar6;
  }
  if ((pQVar7 != (QScreen *)0x0) &&
     (pQVar10 = QWidget::windowHandle(&this->super_QWidget), pQVar10 != (QWindow *)0x0)) {
    QWindow::setScreen((QScreen *)pQVar10);
  }
  QWidget::move(&this->super_QWidget,&local_60);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_78);
LAB_00493682:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::adjustPosition(QWidget* w)
{
    Q_D(QDialog);

    if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme())
        if (theme->themeHint(QPlatformTheme::WindowAutoPlacement).toBool())
            return;
    QPoint p(0, 0);
    int extraw = 0, extrah = 0;
    const QWindow *parentWindow = nullptr;
    if (w) {
        w = w->window();
    } else {
        parentWindow = d->transientParentWindow();
    }
    QRect desk;
    QScreen *scrn = nullptr;
    if (w)
        scrn = w->screen();
    else if (parentWindow)
        scrn = parentWindow->screen();
    else if (QGuiApplication::primaryScreen()->virtualSiblings().size() > 1)
        scrn = QGuiApplication::screenAt(QCursor::pos());
    else
        scrn = screen();
    if (scrn)
        desk = scrn->availableGeometry();

    QWidgetList list = QApplication::topLevelWidgets();
    for (int i = 0; (extraw == 0 || extrah == 0) && i < list.size(); ++i) {
        QWidget * current = list.at(i);
        if (current->isVisible()) {
            int framew = current->geometry().x() - current->x();
            int frameh = current->geometry().y() - current->y();

            extraw = qMax(extraw, framew);
            extrah = qMax(extrah, frameh);
        }
    }

    // sanity check for decoration frames. With embedding, we
    // might get extraordinary values
    if (extraw == 0 || extrah == 0 || extraw >= 10 || extrah >= 40) {
        extrah = 40;
        extraw = 10;
    }


    if (w) {
        // Use pos() if the widget is embedded into a native window
        QPoint pp;
        if (w->windowHandle() && qvariant_cast<WId>(w->windowHandle()->property("_q_embedded_native_parent_handle")))
            pp = w->pos();
        else
            pp = w->mapToGlobal(QPoint(0,0));
        p = QPoint(pp.x() + w->width()/2,
                    pp.y() + w->height()/ 2);
    } else if (parentWindow) {
        // QTBUG-63406: Widget-based dialog in QML, which has no Widget parent
        // but a transient parent window.
        QPoint pp = parentWindow->mapToGlobal(QPoint(0, 0));
        p = QPoint(pp.x() + parentWindow->width() / 2, pp.y() + parentWindow->height() / 2);
    } else {
        // p = middle of the desktop
        p = QPoint(desk.x() + desk.width()/2, desk.y() + desk.height()/2);
    }

    // p = origin of this
    p = QPoint(p.x()-width()/2 - extraw,
                p.y()-height()/2 - extrah);


    if (p.x() + extraw + width() > desk.x() + desk.width())
        p.setX(desk.x() + desk.width() - width() - extraw);
    if (p.x() < desk.x())
        p.setX(desk.x());

    if (p.y() + extrah + height() > desk.y() + desk.height())
        p.setY(desk.y() + desk.height() - height() - extrah);
    if (p.y() < desk.y())
        p.setY(desk.y());

    // QTBUG-52735: Manually set the correct target screen since scaling in a
    // subsequent call to QWindow::resize() may otherwise use the wrong factor
    // if the screen changed notification is still in an event queue.
    if (scrn) {
        if (QWindow *window = windowHandle())
            window->setScreen(scrn);
    }

    move(p);
}